

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_trace_table_test.cc
# Opt level: O1

void __thiscall StackTraceTableTest_Basic_Test::TestBody(StackTraceTableTest_Basic_Test *this)

{
  __uniq_ptr_data<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>,_true,_true>
  _Var1;
  __uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  local_20;
  EntryPtr e;
  StackTraceTableTestHelper h;
  
  e._M_t.
  super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ._M_t.
  super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl =
       (__uniq_ptr_data<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>,_true,_true>
        )(__uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          )0x0;
  StackTraceTableTestHelper::CheckTracesAndReset((StackTraceTableTestHelper *)&e,TestBody::k1,1);
  _Var1.
  super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ._M_t.
  super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl =
       (__uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
        )operator_new(0x110);
  *(undefined8 *)
   _Var1.
   super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
   ._M_t.
   super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
   .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl = 0x400;
  *(undefined8 *)
   ((long)_Var1.
          super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          ._M_t.
          super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl + 8) = 2;
  *(undefined8 *)
   ((long)_Var1.
          super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          ._M_t.
          super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl + 0x10) = 1
  ;
  *(undefined8 *)
   ((long)_Var1.
          super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          ._M_t.
          super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl + 0x18) = 2
  ;
  *(undefined8 *)
   ((long)_Var1.
          super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          ._M_t.
          super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl + 0x108) =
       0;
  ((__uniq_ptr_data<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>,_true,_true>
    *)((long)_Var1.
             super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
             ._M_t.
             super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
             .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl + 0x108)
  )->
  super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
       = (__uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          )e._M_t.
           super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
           ._M_t.
           super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
           .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl;
  local_20._M_t.
  super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl =
       (tuple<StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
        )(_Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          )0x0;
  e._M_t.
  super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ._M_t.
  super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl =
       (__uniq_ptr_data<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>,_true,_true>
        )(__uniq_ptr_data<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>,_true,_true>
          )_Var1.
           super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
           ._M_t.
           super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
           .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl;
  std::
  unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ::~unique_ptr((unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
                 *)&local_20);
  StackTraceTableTestHelper::CheckTracesAndReset((StackTraceTableTestHelper *)&e,TestBody::k2,6);
  _Var1.
  super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ._M_t.
  super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl =
       (__uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
        )operator_new(0x110);
  *(undefined8 *)
   _Var1.
   super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
   ._M_t.
   super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
   .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl = 0x400;
  *(undefined8 *)
   ((long)_Var1.
          super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          ._M_t.
          super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl + 8) = 2;
  *(undefined8 *)
   ((long)_Var1.
          super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          ._M_t.
          super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl + 0x10) = 1
  ;
  *(undefined8 *)
   ((long)_Var1.
          super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          ._M_t.
          super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl + 0x18) = 2
  ;
  *(undefined8 *)
   ((long)_Var1.
          super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          ._M_t.
          super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl + 0x108) =
       0;
  ((__uniq_ptr_data<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>,_true,_true>
    *)((long)_Var1.
             super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
             ._M_t.
             super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
             .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl + 0x108)
  )->
  super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
       = (__uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          )e._M_t.
           super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
           ._M_t.
           super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
           .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl;
  local_20._M_t.
  super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl =
       (tuple<StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
        )(_Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          )0x0;
  e._M_t.
  super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ._M_t.
  super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl =
       (__uniq_ptr_data<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>,_true,_true>
        )(__uniq_ptr_data<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>,_true,_true>
          )_Var1.
           super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
           ._M_t.
           super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
           .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl;
  std::
  unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ::~unique_ptr((unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
                 *)&local_20);
  _Var1.
  super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ._M_t.
  super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl =
       (__uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
        )operator_new(0x110);
  *(undefined8 *)
   _Var1.
   super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
   ._M_t.
   super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
   .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl = 0x200;
  *(undefined8 *)
   ((long)_Var1.
          super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          ._M_t.
          super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl + 8) = 2;
  *(undefined8 *)
   ((long)_Var1.
          super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          ._M_t.
          super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl + 0x10) = 2
  ;
  *(undefined8 *)
   ((long)_Var1.
          super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          ._M_t.
          super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl + 0x18) = 1
  ;
  *(undefined8 *)
   ((long)_Var1.
          super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          ._M_t.
          super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl + 0x108) =
       0;
  ((__uniq_ptr_data<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>,_true,_true>
    *)((long)_Var1.
             super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
             ._M_t.
             super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
             .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl + 0x108)
  )->
  super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
       = (__uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          )e._M_t.
           super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
           ._M_t.
           super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
           .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl;
  local_20._M_t.
  super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl =
       (tuple<StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
        )(_Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          )0x0;
  e._M_t.
  super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ._M_t.
  super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl =
       (__uniq_ptr_data<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>,_true,_true>
        )(__uniq_ptr_data<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>,_true,_true>
          )_Var1.
           super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
           ._M_t.
           super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
           .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl;
  std::
  unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ::~unique_ptr((unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
                 *)&local_20);
  StackTraceTableTestHelper::CheckTracesAndReset((StackTraceTableTestHelper *)&e,TestBody::k3,0xb);
  _Var1.
  super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ._M_t.
  super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl =
       (__uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
        )operator_new(0x110);
  *(undefined8 *)
   _Var1.
   super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
   ._M_t.
   super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
   .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl = 0x400;
  *(undefined8 *)
   ((long)_Var1.
          super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          ._M_t.
          super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl + 8) = 2;
  *(undefined8 *)
   ((long)_Var1.
          super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          ._M_t.
          super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl + 0x10) = 1
  ;
  *(undefined8 *)
   ((long)_Var1.
          super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          ._M_t.
          super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl + 0x18) = 2
  ;
  *(undefined8 *)
   ((long)_Var1.
          super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          ._M_t.
          super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl + 0x108) =
       0;
  ((__uniq_ptr_data<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>,_true,_true>
    *)((long)_Var1.
             super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
             ._M_t.
             super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
             .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl + 0x108)
  )->
  super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
       = (__uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          )e._M_t.
           super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
           ._M_t.
           super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
           .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl;
  local_20._M_t.
  super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl =
       (tuple<StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
        )(_Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          )0x0;
  e._M_t.
  super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ._M_t.
  super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl =
       (__uniq_ptr_data<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>,_true,_true>
        )(__uniq_ptr_data<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>,_true,_true>
          )_Var1.
           super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
           ._M_t.
           super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
           .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl;
  std::
  unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ::~unique_ptr((unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
                 *)&local_20);
  _Var1.
  super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ._M_t.
  super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl =
       (__uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
        )operator_new(0x110);
  *(undefined8 *)
   _Var1.
   super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
   ._M_t.
   super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
   .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl = 2;
  *(undefined8 *)
   ((long)_Var1.
          super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          ._M_t.
          super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl + 8) = 2;
  *(undefined8 *)
   ((long)_Var1.
          super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          ._M_t.
          super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl + 0x10) = 1
  ;
  *(undefined8 *)
   ((long)_Var1.
          super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          ._M_t.
          super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl + 0x18) = 2
  ;
  *(undefined8 *)
   ((long)_Var1.
          super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          ._M_t.
          super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl + 0x108) =
       0;
  ((__uniq_ptr_data<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>,_true,_true>
    *)((long)_Var1.
             super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
             ._M_t.
             super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
             .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl + 0x108)
  )->
  super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
       = (__uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          )e._M_t.
           super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
           ._M_t.
           super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
           .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl;
  local_20._M_t.
  super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl =
       (tuple<StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
        )(_Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          )0x0;
  e._M_t.
  super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ._M_t.
  super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl =
       (__uniq_ptr_data<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>,_true,_true>
        )(__uniq_ptr_data<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>,_true,_true>
          )_Var1.
           super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
           ._M_t.
           super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
           .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl;
  std::
  unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ::~unique_ptr((unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
                 *)&local_20);
  StackTraceTableTestHelper::CheckTracesAndReset((StackTraceTableTestHelper *)&e,TestBody::k5,0xb);
  std::
  unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ::~unique_ptr(&e);
  return;
}

Assistant:

TEST(StackTraceTableTest, Basic) {
  StackTraceTableTestHelper h;

  // Empty table
  static const uintptr_t k1[] = {0};
  h.CheckTracesAndReset(k1, arraysize(k1));

  tcmalloc::StackTrace t1;
  t1.size = static_cast<uintptr_t>(1024);
  t1.depth = static_cast<uintptr_t>(2);
  t1.stack[0] = reinterpret_cast<void*>(1);
  t1.stack[1] = reinterpret_cast<void*>(2);

  tcmalloc::StackTrace t2;
  t2.size = static_cast<uintptr_t>(512);
  t2.depth = static_cast<uintptr_t>(2);
  t2.stack[0] = reinterpret_cast<void*>(2);
  t2.stack[1] = reinterpret_cast<void*>(1);

  // Table w/ just t1
  h.AddTrace(t1);
  static const uintptr_t k2[] = {1, 1024, 2, 1, 2, 0};
  h.CheckTracesAndReset(k2, arraysize(k2));

  // Table w/ t1, t2
  h.AddTrace(t1);
  h.AddTrace(t2);
  static const uintptr_t k3[] = {1, 512, 2, 2, 1, 1, 1024, 2, 1, 2, 0};
  h.CheckTracesAndReset(k3, arraysize(k3));

  // Table w/ t1, t3
  // Same stack as t1, but w/ different size
  tcmalloc::StackTrace t3;
  t3.size = static_cast<uintptr_t>(2);
  t3.depth = static_cast<uintptr_t>(2);
  t3.stack[0] = reinterpret_cast<void*>(1);
  t3.stack[1] = reinterpret_cast<void*>(2);

  h.AddTrace(t1);
  h.AddTrace(t3);
  static const uintptr_t k5[] = {1, 2, 2, 1, 2, 1, 1024, 2, 1, 2, 0};
  h.CheckTracesAndReset(k5, arraysize(k5));
}